

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleIni.h
# Opt level: O0

bool __thiscall
CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::IsMultiLineData
          (CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_> *this,char *a_pData)

{
  bool bVar1;
  char *local_20;
  char *a_pData_local;
  CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_> *this_local;
  
  if (*a_pData == '\0') {
    this_local._7_1_ = false;
  }
  else {
    bVar1 = IsSpace(this,*a_pData);
    local_20 = a_pData;
    if (bVar1) {
      this_local._7_1_ = true;
    }
    else {
      for (; *local_20 != '\0'; local_20 = local_20 + 1) {
        bVar1 = IsNewLineChar(this,*local_20);
        if (bVar1) {
          return true;
        }
      }
      bVar1 = IsSpace(this,local_20[-1]);
      if (bVar1) {
        this_local._7_1_ = true;
      }
      else {
        this_local._7_1_ = false;
      }
    }
  }
  return this_local._7_1_;
}

Assistant:

bool CSimpleIniTempl<SI_CHAR, SI_STRLESS, SI_CONVERTER>::IsMultiLineData(const SI_CHAR *a_pData) const {
	// data is multi-line if it has any of the following features:
	//  * whitespace prefix
	//  * embedded newlines
	//  * whitespace suffix

	// empty string
	if (!*a_pData) {
		return false;
	}

	// check for prefix
	if (IsSpace(*a_pData)) {
		return true;
	}

	// embedded newlines
	while (*a_pData) {
		if (IsNewLineChar(*a_pData)) {
			return true;
		}
		++a_pData;
	}

	// check for suffix
	if (IsSpace(*--a_pData)) {
		return true;
	}

	return false;
}